

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Modules.cpp
# Opt level: O3

string * getEnvImpl_abi_cxx11_(string *__return_storage_ptr__,char *name)

{
  char *__s;
  size_t sVar1;
  char *pcVar2;
  
  __s = getenv(name);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (__s == (char *)0x0) {
    pcVar2 = "";
    __s = "";
  }
  else {
    sVar1 = strlen(__s);
    pcVar2 = __s + sVar1;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string getEnvImpl(const char *name)
{
    #ifdef _MSC_VER
    const DWORD len = GetEnvironmentVariableA(name, 0, 0);
    if (len == 0) return "";
    char* buffer = new char[len];
    GetEnvironmentVariableA(name, buffer, len);
    std::string result(buffer);
    delete [] buffer;
    return result;
    #else
    const char *result = getenv(name);
    if (result != NULL) return result;
    #endif
    return "";
}